

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_ts__cnt_end(fct_ts_t *ts)

{
  fct_ts_t *ts_local;
  
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x4fa
                  ,"void fct_ts__cnt_end(fct_ts_t *)");
  }
  if (ts->mode == ts_mode_cnt) {
    if (ts->mode != ts_mode_end) {
      if (ts->total_test_num == 0) {
        ts->mode = ts_mode_ending;
      }
      else {
        ts->mode = ts_mode_setup;
      }
      return;
    }
    __assert_fail("!((ts)->mode == ts_mode_end)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x4fc
                  ,"void fct_ts__cnt_end(fct_ts_t *)");
  }
  __assert_fail("((ts)->mode == ts_mode_cnt)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x4fb,
                "void fct_ts__cnt_end(fct_ts_t *)");
}

Assistant:

static void
fct_ts__cnt_end(fct_ts_t *ts)
{
    FCT_ASSERT( ts != NULL );
    FCT_ASSERT( fct_ts__is_cnt_mode(ts) );
    FCT_ASSERT( !fct_ts__is_end(ts) );
    if (ts->total_test_num == 0  )
    {
        ts->mode = ts_mode_ending;
    }
    else
    {
        ts->mode = ts_mode_setup;
    }
}